

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObserverManager.h
# Opt level: O3

void ObserverManager::unsubscribe<TicTacProtocol>(TicTacProtocol *observer)

{
  iterator iVar1;
  id_t id;
  id_t local_10;
  
  if (observer != (TicTacProtocol *)0x0) {
    local_10 = (observer->super_BaseObserverProtocol).observerId;
    iVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&unsubscribeMap._M_h,&local_10);
    if (iVar1.
        super__Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
        ._M_cur != (__node_type *)0x0) {
      if (*(code **)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
                           ._M_cur + 0x10) != (code *)0x0) {
        (**(code **)((long)iVar1.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_false>
                           ._M_cur + 0x10))(observer);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>,_std::allocator<std::pair<const_unsigned_long,_void_(*)(BaseObserverProtocol_*)>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&unsubscribeMap._M_h,&local_10);
    }
  }
  return;
}

Assistant:

static void unsubscribe(P* observer) {
        if (observer == nullptr) {
            return;
        }

        auto id = observer->P::observerId;
        auto it = unsubscribeMap.find(id);
        if (it == std::end(unsubscribeMap)) {
            return;
        }

        auto ptr = it->second;
        if (ptr != nullptr) {
            ptr(observer);
        }

        unsubscribeMap.erase(id);
    }